

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O1

void __thiscall
vkt::Draw::DescriptorPoolCreateInfo::DescriptorPoolCreateInfo
          (DescriptorPoolCreateInfo *this,
          vector<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
          *poolSizeCounts,VkDescriptorPoolCreateFlags _flags,deUint32 _maxSets)

{
  pointer pVVar1;
  
  std::vector<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::vector
            (&this->m_poolSizeCounts,poolSizeCounts);
  (this->super_VkDescriptorPoolCreateInfo).sType = VK_STRUCTURE_TYPE_DESCRIPTOR_POOL_CREATE_INFO;
  (this->super_VkDescriptorPoolCreateInfo).pNext = (void *)0x0;
  (this->super_VkDescriptorPoolCreateInfo).flags = _flags;
  (this->super_VkDescriptorPoolCreateInfo).maxSets = _maxSets;
  pVVar1 = (this->m_poolSizeCounts).
           super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (this->super_VkDescriptorPoolCreateInfo).poolSizeCount =
       (deUint32)
       ((ulong)((long)(this->m_poolSizeCounts).
                      super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1) >> 3);
  (this->super_VkDescriptorPoolCreateInfo).pPoolSizes = pVVar1;
  return;
}

Assistant:

DescriptorPoolCreateInfo::DescriptorPoolCreateInfo (const std::vector<vk::VkDescriptorPoolSize>&	poolSizeCounts,
													vk::VkDescriptorPoolCreateFlags					_flags,
													deUint32										_maxSets)
	: m_poolSizeCounts(poolSizeCounts)
{
	sType = vk::VK_STRUCTURE_TYPE_DESCRIPTOR_POOL_CREATE_INFO;
	pNext = DE_NULL;
	flags			= _flags;
	maxSets			= _maxSets;
	poolSizeCount	= static_cast<deUint32>(m_poolSizeCounts.size());
	pPoolSizes		= &m_poolSizeCounts[0];
}